

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O0

REF_STATUS ref_oct_tattle(REF_OCT ref_oct,REF_INT node)

{
  REF_INT node_local;
  REF_OCT ref_oct_local;
  
  printf("corners %d %d %d %d  %d %d %d %d\n",(ulong)(uint)ref_oct->nodes[node * 0x1b],
         (ulong)(uint)ref_oct->nodes[node * 0x1b + 1],(ulong)(uint)ref_oct->nodes[node * 0x1b + 2],
         (ulong)(uint)ref_oct->nodes[node * 0x1b + 3],(ulong)(uint)ref_oct->nodes[node * 0x1b + 4],
         ref_oct->nodes[node * 0x1b + 5],ref_oct->nodes[node * 0x1b + 6],
         ref_oct->nodes[node * 0x1b + 7]);
  printf("edges %d %d %d %d  %d %d %d %d  %d %d %d %d\n",
         (ulong)(uint)ref_oct->nodes[node * 0x1b + 8],(ulong)(uint)ref_oct->nodes[node * 0x1b + 9],
         (ulong)(uint)ref_oct->nodes[node * 0x1b + 10],
         (ulong)(uint)ref_oct->nodes[node * 0x1b + 0xb],
         (ulong)(uint)ref_oct->nodes[node * 0x1b + 0xc],ref_oct->nodes[node * 0x1b + 0xd],
         ref_oct->nodes[node * 0x1b + 0xe],ref_oct->nodes[node * 0x1b + 0xf],
         ref_oct->nodes[node * 0x1b + 0x10],ref_oct->nodes[node * 0x1b + 0x11],
         ref_oct->nodes[node * 0x1b + 0x12],ref_oct->nodes[node * 0x1b + 0x13]);
  printf("faces %d  %d %d %d %d  %d center %d\n",(ulong)(uint)ref_oct->nodes[node * 0x1b + 0x14],
         (ulong)(uint)ref_oct->nodes[node * 0x1b + 0x15],
         (ulong)(uint)ref_oct->nodes[node * 0x1b + 0x16],
         (ulong)(uint)ref_oct->nodes[node * 0x1b + 0x17],
         (ulong)(uint)ref_oct->nodes[node * 0x1b + 0x18],ref_oct->nodes[node * 0x1b + 0x19],
         ref_oct->nodes[node * 0x1b + 0x1a]);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_oct_tattle(REF_OCT ref_oct, REF_INT node) {
  printf("corners %d %d %d %d  %d %d %d %d\n", ref_oct_c2n(ref_oct, 0, node),
         ref_oct_c2n(ref_oct, 1, node), ref_oct_c2n(ref_oct, 2, node),
         ref_oct_c2n(ref_oct, 3, node), ref_oct_c2n(ref_oct, 4, node),
         ref_oct_c2n(ref_oct, 5, node), ref_oct_c2n(ref_oct, 6, node),
         ref_oct_c2n(ref_oct, 7, node));
  printf("edges %d %d %d %d  %d %d %d %d  %d %d %d %d\n",
         ref_oct_c2n(ref_oct, 8, node), ref_oct_c2n(ref_oct, 9, node),
         ref_oct_c2n(ref_oct, 10, node), ref_oct_c2n(ref_oct, 11, node),
         ref_oct_c2n(ref_oct, 12, node), ref_oct_c2n(ref_oct, 13, node),
         ref_oct_c2n(ref_oct, 14, node), ref_oct_c2n(ref_oct, 15, node),
         ref_oct_c2n(ref_oct, 16, node), ref_oct_c2n(ref_oct, 17, node),
         ref_oct_c2n(ref_oct, 18, node), ref_oct_c2n(ref_oct, 19, node));
  printf("faces %d  %d %d %d %d  %d center %d\n",
         ref_oct_c2n(ref_oct, 20, node), ref_oct_c2n(ref_oct, 21, node),
         ref_oct_c2n(ref_oct, 22, node), ref_oct_c2n(ref_oct, 23, node),
         ref_oct_c2n(ref_oct, 24, node), ref_oct_c2n(ref_oct, 25, node),
         ref_oct_c2n(ref_oct, 26, node));
  return REF_SUCCESS;
}